

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::message_box_helper::blocking_box_win::blocking_box_win
          (blocking_box_win *this,wstring *title_,wstring *message_)

{
  wstring *in_RDX;
  wstring *in_RSI;
  drawable_window *in_RDI;
  bool in_stack_0000000e;
  bool in_stack_0000000f;
  drawable_window *in_stack_00000010;
  drawable_window *in_stack_00000018;
  button *in_stack_00000020;
  blocking_box_win *in_stack_000000a0;
  drawable_window *this_00;
  
  drawable_window::drawable_window(in_stack_00000010,in_stack_0000000f,in_stack_0000000e);
  (in_RDI->super_base_window)._vptr_base_window = (_func_int **)&PTR__blocking_box_win_0055bc78;
  this_00 = in_RDI + 1;
  std::__cxx11::wstring::wstring((wstring *)this_00,in_RSI);
  std::__cxx11::wstring::wstring((wstring *)&in_RDI[1].super_base_window.is_mapped,in_RDX);
  label::label((label *)this_00,in_RDI);
  button::button(in_stack_00000020,in_stack_00000018);
  initialize(in_stack_000000a0);
  return;
}

Assistant:

blocking_box_win::
        blocking_box_win (
            const std::wstring& title_,
            const std::wstring& message_
        ) : 
            drawable_window(false),
            title(title_),
            message(message_),
            msg(*this),
            btn_ok(*this)
        {
            initialize();
        }